

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdiAreaPrivate::scrollBarPolicyChanged
          (QMdiAreaPrivate *this,Orientation orientation,ScrollBarPolicy policy)

{
  bool bVar1;
  undefined4 uVar2;
  const_iterator o;
  QMdiSubWindow *child_00;
  int in_EDX;
  int in_ESI;
  QList<QPointer<QMdiSubWindow>_> *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  bool enable;
  SubWindowOption option;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  QList<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffffa0;
  undefined1 **ppuVar3;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x612148);
  if (!bVar1) {
    uVar2 = 2;
    if (in_ESI == 1) {
      uVar2 = 1;
    }
    uVar4 = CONCAT13(in_EDX != 1,(int3)in_stack_ffffffffffffffb0);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QPointer<QMdiSubWindow>_>::QList(in_stack_ffffffffffffffa0,in_RDI);
    ppuVar3 = &local_20;
    local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QPointer<QMdiSubWindow>_>::begin(in_stack_ffffffffffffffa0);
    o = QList<QPointer<QMdiSubWindow>_>::end(in_stack_ffffffffffffffa0);
    while (bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,o), bVar1)
    {
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
      child_00 = ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x612232);
      bVar1 = sanityCheck(child_00,(char *)in_RDI);
      if (bVar1) {
        QMdiSubWindow::setOption
                  ((QMdiSubWindow *)CONCAT44(uVar2,uVar4),(SubWindowOption)((ulong)ppuVar3 >> 0x20),
                   SUB81((ulong)ppuVar3 >> 0x18,0));
      }
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
    }
    updateScrollBars((QMdiAreaPrivate *)__end1.i);
    QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x612284);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::scrollBarPolicyChanged(Qt::Orientation orientation, Qt::ScrollBarPolicy policy)
{
    if (childWindows.isEmpty())
        return;

    const QMdiSubWindow::SubWindowOption option = orientation == Qt::Horizontal ?
        QMdiSubWindow::AllowOutsideAreaHorizontally : QMdiSubWindow::AllowOutsideAreaVertically;
    const bool enable = policy != Qt::ScrollBarAlwaysOff;
    // Take a copy because child->setOption() may indirectly call QCoreApplication::sendEvent(),
    // the latter could call unknown code that could e.g. recurse into the class
    // modifying childWindows.
    const auto subWindows = childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::scrollBarPolicyChanged"))
            continue;
        child->setOption(option, enable);
    }
    updateScrollBars();
}